

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O3

void __thiscall Catch::Config::~Config(Config *this)

{
  IStream *pIVar1;
  pointer pcVar2;
  
  (this->super_IConfig).super_NonCopyable._vptr_NonCopyable = (_func_int **)&PTR__Config_0019d880;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->m_testSpec).m_invalidArgs);
  clara::std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
            (&(this->m_testSpec).m_filters);
  pIVar1 = (this->m_stream)._M_t.
           super___uniq_ptr_impl<const_Catch::IStream,_std::default_delete<const_Catch::IStream>_>.
           _M_t.
           super__Tuple_impl<0UL,_const_Catch::IStream_*,_std::default_delete<const_Catch::IStream>_>
           .super__Head_base<0UL,_const_Catch::IStream_*,_false>._M_head_impl;
  if (pIVar1 != (IStream *)0x0) {
    (*pIVar1->_vptr_IStream[1])();
  }
  (this->m_stream)._M_t.
  super___uniq_ptr_impl<const_Catch::IStream,_std::default_delete<const_Catch::IStream>_>._M_t.
  super__Tuple_impl<0UL,_const_Catch::IStream_*,_std::default_delete<const_Catch::IStream>_>.
  super__Head_base<0UL,_const_Catch::IStream_*,_false>._M_head_impl = (IStream *)0x0;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->m_data).sectionsToRun);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->m_data).testsOrTags);
  pcVar2 = (this->m_data).reporterName._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->m_data).reporterName.field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->m_data).processName._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->m_data).processName.field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->m_data).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->m_data).name.field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->m_data).outputFilename._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->m_data).outputFilename.field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

virtual ~Config() = default;